

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMove4<(moira::Instr)71,(moira::Mode)4,(moira::Size)4>(Moira *this,u16 opcode)

{
  long lVar1;
  AEStackFrame frame;
  bool bVar2;
  u32 addr;
  int iVar3;
  int iVar4;
  ushort in_SI;
  Moira *in_RDI;
  int format;
  u64 flags2;
  u64 flags1;
  u64 flags0;
  int dst;
  int src;
  u32 data;
  u32 ea;
  u16 ird;
  u32 in_stack_ffffffffffffff78;
  u32 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff86;
  u32 pc;
  u32 n;
  undefined4 in_stack_ffffffffffffff90;
  u32 in_stack_ffffffffffffff94;
  Moira *in_stack_ffffffffffffff98;
  undefined4 local_14;
  
  pc = (u32)in_RDI;
  n = (u32)((ulong)in_RDI >> 0x20);
  getIRD(in_RDI);
  bVar2 = readOp<(moira::Mode)4,(moira::Size)4,0ul>
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,(u32 *)CONCAT44(n,pc),
                     (u32 *)CONCAT26(in_stack_ffffffffffffff86,
                                     CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)))
  ;
  if (bVar2) {
    bVar2 = NBIT<(moira::Size)4>((ulong)local_14);
    *(bool *)(CONCAT44(n,pc) + 0x5c9b) = bVar2;
    bVar2 = ZERO<(moira::Size)4>((ulong)local_14);
    lVar1 = CONCAT44(n,pc);
    *(bool *)(lVar1 + 0x5c9c) = bVar2;
    *(undefined1 *)(lVar1 + 0x5c9d) = 0;
    *(undefined1 *)(lVar1 + 0x5c9e) = 0;
    prefetch<0ul>((Moira *)CONCAT26(in_stack_ffffffffffffff86,
                                    CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)));
    (**(code **)(*(long *)CONCAT44(n,pc) + 200))((long *)CONCAT44(n,pc),0xfffffffe);
    addr = computeEA<(moira::Mode)4,(moira::Size)4,0ul>
                     ((Moira *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),n);
    bVar2 = misaligned<(moira::Size)4>((Moira *)CONCAT44(n,pc),addr);
    if (bVar2) {
      iVar3 = addr + 2;
      iVar4 = *(int *)(CONCAT44(n,pc) + 0x5c90) + 2;
      getSR((Moira *)0x287741);
      makeFrame<40ul>((Moira *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),n,pc,
                      (u16)((uint)iVar4 >> 0x10),(u16)iVar4);
      frame.addr = n;
      frame._0_4_ = pc;
      frame.ird = (short)in_stack_ffffffffffffff90;
      frame.sr = (short)((uint)in_stack_ffffffffffffff90 >> 0x10);
      frame.pc = in_stack_ffffffffffffff94;
      execAddressError((Moira *)CONCAT26((short)((uint)iVar4 >> 0x10),CONCAT24((short)iVar4,iVar3)),
                       frame,in_stack_ffffffffffffff7c);
    }
    else {
      writeM<(moira::Mode)4,(moira::Size)4,5ul>
                ((Moira *)CONCAT26(in_stack_ffffffffffffff86,
                                   CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)),
                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      updateAn<(moira::Mode)4,(moira::Size)4>((Moira *)CONCAT44(n,pc),(int)(uint)in_SI >> 9 & 7);
    }
  }
  return;
}

Assistant:

void
Moira::execMove4(u16 opcode)
{
    u16 ird = getIRD();
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    /* Source: http://pasti.fxatari.com/68kdocs/68kPrefetch.html
     *
     * "When the destination addressing mode is pre-decrement, steps 4 and 5
     *  above are inverted. So it behaves like a read modify instruction and it
     *  is a class 0 instruction. Note: The behavior is the same disregarding
     *  transfer size (byte, word or long), and disregarding the source
     *  addressing mode."
     */
    if (!readOp <M,S,STD_AE_FRAME> (src, ea, data)) return;

    // Determine next address error stack frame format
    const u64 flags0 = AE_WRITE | AE_DATA;
    const u64 flags1 = AE_WRITE | AE_DATA | AE_SET_CB3;
    const u64 flags2 = AE_WRITE | AE_DATA;
    int format = (S == Long) ? 0 : reg.sr.c ? 1 : 2;

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    prefetch();
    sync(-2);

    ea = computeEA<MODE_PD, S>(dst);
    
    // Check for address error
    if (misaligned<S>(ea)) {
        if (format == 0) execAddressError(makeFrame<flags0>(ea + 2, reg.pc + 2, getSR(), ird));
        if (format == 1) execAddressError(makeFrame<flags1>(ea, reg.pc + 2), 2);
        if (format == 2) execAddressError(makeFrame<flags2>(ea, reg.pc + 2), 2);
        if (S != Long) updateAn <MODE_PD, S> (dst);
        return;
    }
    
    writeM<MODE_PD, S, REVERSE | POLLIPL>(ea, data);
    updateAn<MODE_PD, S>(dst);
}